

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

ExternalValueExpr * __thiscall
SQCompilation::CheckerVisitor::findExternalValue(CheckerVisitor *this,Expr *e)

{
  ExternalValueExpr *lhs;
  SQChar *ref;
  ValueRef *pVVar1;
  ExternalValueExpr *pEVar2;
  SQChar buffer [128];
  
  lhs = (ExternalValueExpr *)maybeEval(this,e,true);
  if ((lhs->super_Expr).super_Node._op != TO_EXTERNAL_VALUE) {
    buffer[0x70] = '\0';
    buffer[0x71] = '\0';
    buffer[0x72] = '\0';
    buffer[0x73] = '\0';
    buffer[0x74] = '\0';
    buffer[0x75] = '\0';
    buffer[0x76] = '\0';
    buffer[0x77] = '\0';
    buffer[0x78] = '\0';
    buffer[0x79] = '\0';
    buffer[0x7a] = '\0';
    buffer[0x7b] = '\0';
    buffer[0x7c] = '\0';
    buffer[0x7d] = '\0';
    buffer[0x7e] = '\0';
    buffer[0x7f] = '\0';
    buffer[0x60] = '\0';
    buffer[0x61] = '\0';
    buffer[0x62] = '\0';
    buffer[99] = '\0';
    buffer[100] = '\0';
    buffer[0x65] = '\0';
    buffer[0x66] = '\0';
    buffer[0x67] = '\0';
    buffer[0x68] = '\0';
    buffer[0x69] = '\0';
    buffer[0x6a] = '\0';
    buffer[0x6b] = '\0';
    buffer[0x6c] = '\0';
    buffer[0x6d] = '\0';
    buffer[0x6e] = '\0';
    buffer[0x6f] = '\0';
    buffer[0x50] = '\0';
    buffer[0x51] = '\0';
    buffer[0x52] = '\0';
    buffer[0x53] = '\0';
    buffer[0x54] = '\0';
    buffer[0x55] = '\0';
    buffer[0x56] = '\0';
    buffer[0x57] = '\0';
    buffer[0x58] = '\0';
    buffer[0x59] = '\0';
    buffer[0x5a] = '\0';
    buffer[0x5b] = '\0';
    buffer[0x5c] = '\0';
    buffer[0x5d] = '\0';
    buffer[0x5e] = '\0';
    buffer[0x5f] = '\0';
    buffer[0x40] = '\0';
    buffer[0x41] = '\0';
    buffer[0x42] = '\0';
    buffer[0x43] = '\0';
    buffer[0x44] = '\0';
    buffer[0x45] = '\0';
    buffer[0x46] = '\0';
    buffer[0x47] = '\0';
    buffer[0x48] = '\0';
    buffer[0x49] = '\0';
    buffer[0x4a] = '\0';
    buffer[0x4b] = '\0';
    buffer[0x4c] = '\0';
    buffer[0x4d] = '\0';
    buffer[0x4e] = '\0';
    buffer[0x4f] = '\0';
    buffer[0x30] = '\0';
    buffer[0x31] = '\0';
    buffer[0x32] = '\0';
    buffer[0x33] = '\0';
    buffer[0x34] = '\0';
    buffer[0x35] = '\0';
    buffer[0x36] = '\0';
    buffer[0x37] = '\0';
    buffer[0x38] = '\0';
    buffer[0x39] = '\0';
    buffer[0x3a] = '\0';
    buffer[0x3b] = '\0';
    buffer[0x3c] = '\0';
    buffer[0x3d] = '\0';
    buffer[0x3e] = '\0';
    buffer[0x3f] = '\0';
    buffer[0x20] = '\0';
    buffer[0x21] = '\0';
    buffer[0x22] = '\0';
    buffer[0x23] = '\0';
    buffer[0x24] = '\0';
    buffer[0x25] = '\0';
    buffer[0x26] = '\0';
    buffer[0x27] = '\0';
    buffer[0x28] = '\0';
    buffer[0x29] = '\0';
    buffer[0x2a] = '\0';
    buffer[0x2b] = '\0';
    buffer[0x2c] = '\0';
    buffer[0x2d] = '\0';
    buffer[0x2e] = '\0';
    buffer[0x2f] = '\0';
    buffer[0x10] = '\0';
    buffer[0x11] = '\0';
    buffer[0x12] = '\0';
    buffer[0x13] = '\0';
    buffer[0x14] = '\0';
    buffer[0x15] = '\0';
    buffer[0x16] = '\0';
    buffer[0x17] = '\0';
    buffer[0x18] = '\0';
    buffer[0x19] = '\0';
    buffer[0x1a] = '\0';
    buffer[0x1b] = '\0';
    buffer[0x1c] = '\0';
    buffer[0x1d] = '\0';
    buffer[0x1e] = '\0';
    buffer[0x1f] = '\0';
    buffer[0] = '\0';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    buffer[4] = '\0';
    buffer[5] = '\0';
    buffer[6] = '\0';
    buffer[7] = '\0';
    buffer[8] = '\0';
    buffer[9] = '\0';
    buffer[10] = '\0';
    buffer[0xb] = '\0';
    buffer[0xc] = '\0';
    buffer[0xd] = '\0';
    buffer[0xe] = '\0';
    buffer[0xf] = '\0';
    ref = computeNameRef(this,(Expr *)lhs,buffer,0x80);
    if (((ref == (SQChar *)0x0) || (pVVar1 = findValueInScopes(this,ref), pVVar1 == (ValueRef *)0x0)
        ) || (1 < pVVar1->state - VRS_EXPRESSION)) {
      lhs = (ExternalValueExpr *)0x0;
    }
    else {
      pEVar2 = (ExternalValueExpr *)maybeEval(this,pVVar1->expression,true);
      lhs = (ExternalValueExpr *)0x0;
      if ((pEVar2->super_Expr).super_Node._op == TO_EXTERNAL_VALUE) {
        lhs = pEVar2;
      }
    }
  }
  return lhs;
}

Assistant:

const ExternalValueExpr *CheckerVisitor::findExternalValue(const Expr *e) {
  const Expr *ee = maybeEval(e, true);

  if (ee->op() == TO_EXTERNAL_VALUE)
    return static_cast<const ExternalValueExpr *>(ee);

  SQChar buffer[128] = { 0 };
  const SQChar *name = computeNameRef(ee, buffer, sizeof buffer);
  if (!name)
    return nullptr;

  const ValueRef *v = findValueInScopes(name);

  if (!v || !v->hasValue())
    return nullptr;

  const Expr *expr = maybeEval(v->expression, true);

  if (expr->op() == TO_EXTERNAL_VALUE)
    return static_cast<const ExternalValueExpr *>(expr);

  return nullptr;
}